

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O0

bool pbrt::RealisticCamera::IntersectSphericalElement
               (Float radius,Float zCenter,Ray *ray,Float *t,Normal3f *n)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  float *pfVar4;
  undefined8 *in_RDX;
  float *in_RSI;
  Vector3<float> *in_RDI;
  float in_XMM0_Da;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Point3<float> PVar12;
  Vector3<float> VVar13;
  Normal3<float> NVar14;
  bool useCloserT;
  Float t1;
  Float t0;
  Float C;
  Float B;
  Float A;
  Point3f o;
  undefined8 in_stack_fffffffffffffec8;
  Point3<float> *pPVar15;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  float fVar16;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  Point3<float> local_80;
  undefined8 local_74;
  undefined4 local_6c;
  undefined1 local_65;
  float local_64;
  float local_60;
  undefined4 local_5c;
  float local_58;
  undefined4 local_54;
  undefined8 local_50;
  float local_48;
  Point3<float> local_40;
  undefined8 local_34;
  float local_2c;
  undefined8 *local_28;
  float *local_20;
  Vector3<float> *local_18;
  float local_8;
  bool local_1;
  undefined1 auVar11 [56];
  
  pPVar15 = &local_40;
  auVar11 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_8 = in_XMM0_Da;
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (float)((ulong)in_stack_fffffffffffffec8 >> 0x20),(float)in_stack_fffffffffffffec8,0.0)
  ;
  PVar12 = Point3<float>::operator-(pPVar15,in_RDI);
  local_48 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar11;
  local_50 = vmovlpd_avx(auVar5._0_16_);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_18[1].super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)local_18[1].super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(local_18[1].super_Tuple3<pbrt::Vector3,_float>.y *
                                         local_18[1].super_Tuple3<pbrt::Vector3,_float>.y)));
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_18[1].super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)local_18[1].super_Tuple3<pbrt::Vector3,_float>.z),auVar2);
  local_54 = auVar2._0_4_;
  local_34._0_4_ = (uint)local_50;
  local_34._4_4_ = (float)((ulong)local_50 >> 0x20);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_34),
                           ZEXT416((uint)local_18[1].super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(local_18[1].super_Tuple3<pbrt::Vector3,_float>.y *
                                         local_34._4_4_)));
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_48),
                           ZEXT416((uint)local_18[1].super_Tuple3<pbrt::Vector3,_float>.z),auVar2);
  local_58 = auVar2._0_4_ * 2.0;
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_34),ZEXT416((uint)local_34),
                           ZEXT416((uint)(local_34._4_4_ * local_34._4_4_)));
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_48),ZEXT416((uint)local_48),auVar2);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_8),ZEXT416((uint)-local_8),auVar2);
  local_5c = auVar2._0_4_;
  local_34 = local_50;
  local_2c = local_48;
  bVar3 = Quadratic(in_stack_fffffffffffffef0,(float)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                    SUB84(in_stack_fffffffffffffee8,0),(float *)pPVar15,(float *)in_RDI);
  if (bVar3) {
    local_65 = 0.0 < local_18[1].super_Tuple3<pbrt::Vector3,_float>.z != local_8 < 0.0;
    if ((bool)local_65) {
      pfVar4 = std::min<float>(&local_60,&local_64);
      fVar16 = *pfVar4;
    }
    else {
      pfVar4 = std::max<float>(&local_60,&local_64);
      fVar16 = *pfVar4;
    }
    *local_20 = fVar16;
    if (0.0 <= *local_20) {
      auVar11 = (undefined1  [56])0x0;
      VVar13 = pbrt::operator*(in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
      auVar6._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar11;
      vmovlpd_avx(auVar6._0_16_);
      PVar12 = Point3<float>::operator+(pPVar15,in_RDI);
      auVar7._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar7._8_56_ = auVar11;
      vmovlpd_avx(auVar7._0_16_);
      pPVar15 = &local_80;
      Vector3<float>::Vector3<float>
                ((Vector3<float> *)CONCAT44(fVar16,in_stack_fffffffffffffed0),pPVar15);
      Normal3<float>::Normal3<float>
                ((Normal3<float> *)CONCAT44(fVar16,in_stack_fffffffffffffed0),
                 (Vector3<float> *)pPVar15);
      *(undefined4 *)(local_28 + 1) = local_6c;
      *local_28 = local_74;
      NVar14 = Normalize<float>((Normal3<float> *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      auVar8._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar8._8_56_ = auVar11;
      vmovlpd_avx(auVar8._0_16_);
      VVar13 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar16,in_stack_fffffffffffffed0)
                         );
      auVar9._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._8_56_ = auVar11;
      vmovlpd_avx(auVar9._0_16_);
      NVar14 = FaceForward<float>((Normal3<float> *)
                                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  (Vector3<float> *)in_stack_fffffffffffffee8);
      auVar10._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar10._8_56_ = auVar11;
      uVar1 = vmovlpd_avx(auVar10._0_16_);
      *local_28 = uVar1;
      *(float *)(local_28 + 1) = NVar14.super_Tuple3<pbrt::Normal3,_float>.z;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

PBRT_CPU_GPU
    static bool IntersectSphericalElement(Float radius, Float zCenter, const Ray &ray,
                                          Float *t, Normal3f *n) {
        // Compute _t0_ and _t1_ for ray--element intersection
        Point3f o = ray.o - Vector3f(0, 0, zCenter);
        Float A = ray.d.x * ray.d.x + ray.d.y * ray.d.y + ray.d.z * ray.d.z;
        Float B = 2 * (ray.d.x * o.x + ray.d.y * o.y + ray.d.z * o.z);
        Float C = o.x * o.x + o.y * o.y + o.z * o.z - radius * radius;
        Float t0, t1;
        if (!Quadratic(A, B, C, &t0, &t1))
            return false;

        // Select intersection $t$ based on ray direction and element curvature
        bool useCloserT = (ray.d.z > 0) ^ (radius < 0);
        *t = useCloserT ? std::min(t0, t1) : std::max(t0, t1);
        if (*t < 0)
            return false;

        // Compute surface normal of element at ray intersection point
        *n = Normal3f(Vector3f(o + *t * ray.d));
        *n = FaceForward(Normalize(*n), -ray.d);

        return true;
    }